

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

us_socket_context_t *
us_create_socket_context
          (int ssl,us_loop_t *loop,int context_ext_size,us_socket_context_options_t options)

{
  us_socket_context_options_t options_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  us_internal_ssl_socket_context_t *puVar6;
  us_socket_context_t *context;
  
  pcVar1 = deep_str_copy(options.ca_file_name);
  pcVar2 = deep_str_copy(options.cert_file_name);
  pcVar3 = deep_str_copy(options.dh_params_file_name);
  pcVar4 = deep_str_copy(options.key_file_name);
  pcVar5 = deep_str_copy(options.passphrase);
  if (ssl != 0) {
    options_00.cert_file_name = pcVar2;
    options_00.key_file_name = pcVar4;
    options_00.passphrase = pcVar5;
    options_00.dh_params_file_name = pcVar3;
    options_00.ca_file_name = pcVar1;
    options_00.ssl_prefer_low_memory_usage = options.ssl_prefer_low_memory_usage;
    options_00._44_4_ = options._44_4_;
    puVar6 = us_internal_create_ssl_socket_context(loop,context_ext_size,options_00);
    return &puVar6->sc;
  }
  context = (us_socket_context_t *)malloc((long)context_ext_size + 0x90);
  context->loop = loop;
  context->next = (us_socket_context_t *)0x0;
  context->head = (us_socket_t *)0x0;
  context->iterator = (us_socket_t *)0x0;
  context->ignore_data = default_ignore_data_handler;
  (context->options).key_file_name = pcVar4;
  (context->options).cert_file_name = pcVar2;
  (context->options).passphrase = pcVar5;
  (context->options).dh_params_file_name = pcVar3;
  (context->options).ca_file_name = pcVar1;
  (context->options).ssl_prefer_low_memory_usage = options.ssl_prefer_low_memory_usage;
  *(undefined4 *)&(context->options).field_0x2c = options._44_4_;
  us_internal_loop_link(loop,context);
  return context;
}

Assistant:

struct us_socket_context_t *us_create_socket_context(int ssl, struct us_loop_t *loop, int context_ext_size, struct us_socket_context_options_t options) {
    /* For ease of use we copy all passed strings here */
    options.ca_file_name = deep_str_copy(options.ca_file_name);
    options.cert_file_name = deep_str_copy(options.cert_file_name);
    options.dh_params_file_name = deep_str_copy(options.dh_params_file_name);
    options.key_file_name = deep_str_copy(options.key_file_name);
    options.passphrase = deep_str_copy(options.passphrase);

#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_context_t *) us_internal_create_ssl_socket_context(loop, context_ext_size, options);
    }
#endif

    struct us_socket_context_t *context = malloc(sizeof(struct us_socket_context_t) + context_ext_size);
    context->loop = loop;
    context->head = 0;
    context->iterator = 0;
    context->next = 0;
    context->ignore_data = default_ignore_data_handler;
    context->options = options;

    us_internal_loop_link(loop, context);
    return context;
}